

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O2

string * channelSensorReadings_abi_cxx11_
                   (string *__return_storage_ptr__,Device *device,int dir,size_t chan)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensors;
  string reading;
  string key;
  ArgInfo info;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  string local_308 [32];
  string local_2e8;
  string local_2c8 [32];
  ArgInfo local_2a8 [64];
  string local_268 [8];
  long local_260;
  string local_248 [8];
  long local_240;
  string local_228 [8];
  long local_220;
  Range local_200 [8];
  double local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  (**(code **)(*(long *)device + 0x2d0))(&local_320,device,dir);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)local_320.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_320.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    std::__cxx11::string::string
              (local_2c8,
               (string *)
               ((long)&((local_320.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    (**(code **)(*(long *)device + 0x2d8))(local_2a8,device,dir,chan,local_2c8);
    (**(code **)(*(long *)device + 0x2e0))(local_308,device,dir,chan,local_2c8);
    poVar1 = std::operator<<(local_1a8,"     * ");
    std::operator<<(poVar1,(string *)
                           ((long)&((local_320.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar2));
    if (local_260 != 0) {
      poVar1 = std::operator<<(local_1a8," (");
      poVar1 = std::operator<<(poVar1,local_268);
      std::operator<<(poVar1,")");
    }
    std::operator<<(local_1a8,":");
    if (2.2250738585072014e-308 < local_1f8) {
      toString_abi_cxx11_(&local_2e8,local_200);
      std::operator<<(local_1a8,(string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    toString<std::__cxx11::string>(&local_2e8,local_1e8);
    std::operator<<(local_1a8,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    poVar1 = std::operator<<(local_1a8," ");
    std::operator<<(poVar1,local_308);
    if (local_220 != 0) {
      poVar1 = std::operator<<(local_1a8," ");
      std::operator<<(poVar1,local_228);
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
    if (local_240 != 0) {
      poVar1 = std::operator<<(local_1a8,"        ");
      poVar1 = std::operator<<(poVar1,local_248);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__cxx11::string::~string(local_308);
    SoapySDR::ArgInfo::~ArgInfo(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    lVar2 = lVar2 + 0x20;
  }
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_320);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string channelSensorReadings(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    /*******************************************************************
     * Channel sensor readings
     ******************************************************************/
    std::vector<std::string> sensors = device->listSensors(dir, chan);

    for (size_t i = 0; i < sensors.size(); i++)
    {
        std::string key = sensors[i];
        SoapySDR::ArgInfo info = device->getSensorInfo(dir, chan, key);
        std::string reading = device->readSensor(dir, chan, key);

        ss << "     * " << sensors[i];
        if (not info.name.empty()) ss << " (" << info.name << ")";
        ss << ":";
        if (info.range.maximum() > std::numeric_limits<double>::min()) ss << toString(info.range);
        ss << toString(info.options);
        ss << " " << reading;
        if (not info.units.empty()) ss << " " << info.units;
        ss << std::endl;
        if (not info.description.empty()) ss << "        " << info.description << std::endl;
    }

    return ss.str();
}